

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog.h
# Opt level: O1

void spdlog::error<char_const*>(char **msg)

{
  undefined8 this;
  int iVar1;
  
  if (details::registry::instance()::s_instance == '\0') {
    iVar1 = __cxa_guard_acquire(&details::registry::instance()::s_instance);
    if (iVar1 != 0) {
      details::registry::registry((registry *)details::registry::instance()::s_instance);
      __cxa_atexit(details::registry::~registry,details::registry::instance()::s_instance,
                   &__dso_handle);
      __cxa_guard_release(&details::registry::instance()::s_instance);
    }
  }
  this = details::registry::instance()::s_instance._304_8_;
  strlen(*msg);
  logger::log((logger *)this,0.0);
  return;
}

Assistant:

inline void error(const T &msg)
{
    default_logger_raw()->error(msg);
}